

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sscCore.c
# Opt level: O0

Gia_Man_t * Ssc_PerformSweepingInt(Gia_Man_t *pAig,Gia_Man_t *pCare,Ssc_Pars_t *pPars)

{
  Gia_Man_t *pGVar1;
  undefined8 uVar2;
  undefined8 uVar3;
  Vec_Int_t *p_00;
  int iVar4;
  int iVar5;
  uint uVar6;
  uint uVar7;
  abctime aVar8;
  abctime aVar9;
  Ssc_Man_t *p_01;
  abctime aVar10;
  Gia_Obj_t *pGVar11;
  bool bVar12;
  int status;
  int nRefined;
  int fCompl;
  int i;
  abctime clkTotal;
  abctime clk;
  Gia_Obj_t *pRepr;
  Gia_Obj_t *pObj;
  Gia_Man_t *pTemp;
  Gia_Man_t *pResult;
  Ssc_Man_t *p;
  Ssc_Pars_t *pPars_local;
  Gia_Man_t *pCare_local;
  Gia_Man_t *pAig_local;
  
  aVar8 = Abc_Clock();
  aVar9 = Abc_Clock();
  iVar4 = Gia_ManRegNum(pCare);
  if (iVar4 != 0) {
    __assert_fail("Gia_ManRegNum(pCare) == 0",
                  "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/proof/ssc/sscCore.c"
                  ,0x110,"Gia_Man_t *Ssc_PerformSweepingInt(Gia_Man_t *, Gia_Man_t *, Ssc_Pars_t *)"
                 );
  }
  iVar4 = Gia_ManCiNum(pAig);
  iVar5 = Gia_ManCiNum(pCare);
  if (iVar4 != iVar5) {
    __assert_fail("Gia_ManCiNum(pAig) == Gia_ManCiNum(pCare)",
                  "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/proof/ssc/sscCore.c"
                  ,0x111,"Gia_Man_t *Ssc_PerformSweepingInt(Gia_Man_t *, Gia_Man_t *, Ssc_Pars_t *)"
                 );
  }
  iVar4 = Gia_ManIsNormalized(pAig);
  if (iVar4 == 0) {
    __assert_fail("Gia_ManIsNormalized(pAig)",
                  "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/proof/ssc/sscCore.c"
                  ,0x112,"Gia_Man_t *Ssc_PerformSweepingInt(Gia_Man_t *, Gia_Man_t *, Ssc_Pars_t *)"
                 );
  }
  iVar4 = Gia_ManIsNormalized(pCare);
  if (iVar4 == 0) {
    __assert_fail("Gia_ManIsNormalized(pCare)",
                  "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/proof/ssc/sscCore.c"
                  ,0x113,"Gia_Man_t *Ssc_PerformSweepingInt(Gia_Man_t *, Gia_Man_t *, Ssc_Pars_t *)"
                 );
  }
  Gia_ManRandom(1);
  p_01 = Ssc_ManStart(pAig,pCare,pPars);
  if (p_01 == (Ssc_Man_t *)0x1) {
    pAig_local = Gia_ManDupZero(pAig);
  }
  else if (p_01 == (Ssc_Man_t *)0x0) {
    pAig_local = Gia_ManDup(pAig);
  }
  else {
    if (p_01->pPars->fVerbose != 0) {
      uVar6 = Ssc_GiaEstimateCare(p_01->pFraig,5);
      printf("Care set produced %d hits out of %d.\n",(ulong)uVar6,0x280);
    }
    do {
      Ssc_GiaRandomPiPattern(p_01->pFraig,5,(Vec_Int_t *)0x0);
      Ssc_GiaSimRound(p_01->pFraig);
      iVar4 = Ssc_GiaTransferPiPattern(pAig,p_01->pFraig,p_01->vPivot);
      if (iVar4 == 0) break;
      Ssc_GiaSimRound(pAig);
      iVar4 = Ssc_GiaClassesRefine(pAig);
      if (pPars->fVerbose != 0) {
        Gia_ManEquivPrintClasses(pAig,0,0.0);
      }
      iVar5 = Gia_ManCandNum(pAig);
    } while (iVar5 / 100 < iVar4);
    aVar10 = Abc_Clock();
    p_01->timeSimInit = (aVar10 - aVar9) + p_01->timeSimInit;
    Gia_ManFillValue(pAig);
    pGVar11 = Gia_ManConst0(pAig);
    pGVar11->Value = 0;
    nRefined = 0;
    while( true ) {
      iVar4 = Vec_IntSize(pAig->vCis);
      bVar12 = false;
      if (nRefined < iVar4) {
        pRepr = Gia_ManCi(pAig,nRefined);
        bVar12 = pRepr != (Gia_Obj_t *)0x0;
      }
      if (!bVar12) break;
      pGVar1 = p_01->pFraig;
      pGVar11 = Gia_ManCi(p_01->pFraig,nRefined);
      uVar6 = Gia_Obj2Lit(pGVar1,pGVar11);
      pRepr->Value = uVar6;
      nRefined = nRefined + 1;
    }
    Gia_ManHashStart(p_01->pFraig);
    Ssc_GiaResetPiPattern(pAig,pPars->nWords);
    Ssc_GiaSavePiPattern(pAig,p_01->vPivot);
    nRefined = 0;
    while( true ) {
      bVar12 = false;
      if (nRefined < pAig->nObjs) {
        pRepr = Gia_ManObj(pAig,nRefined);
        bVar12 = pRepr != (Gia_Obj_t *)0x0;
      }
      if (!bVar12) break;
      iVar4 = Gia_ObjIsCand(pRepr);
      if (iVar4 != 0) {
        if (pAig->iPatsPi == pPars->nWords << 6) {
          aVar9 = Abc_Clock();
          Ssc_GiaSimRound(pAig);
          Ssc_GiaClassesRefine(pAig);
          if (pPars->fVerbose != 0) {
            Gia_ManEquivPrintClasses(pAig,0,0.0);
          }
          Ssc_GiaClassesCheckPairs(pAig,p_01->vDisPairs);
          Vec_IntClear(p_01->vDisPairs);
          Ssc_GiaResetPiPattern(pAig,pPars->nWords);
          Ssc_GiaSavePiPattern(pAig,p_01->vPivot);
          aVar10 = Abc_Clock();
          p_01->timeSimSat = (aVar10 - aVar9) + p_01->timeSimSat;
        }
        iVar4 = Gia_ObjIsAnd(pRepr);
        if (iVar4 != 0) {
          pGVar1 = p_01->pFraig;
          iVar4 = Gia_ObjFanin0Copy(pRepr);
          iVar5 = Gia_ObjFanin1Copy(pRepr);
          uVar6 = Gia_ManHashAnd(pGVar1,iVar4,iVar5);
          pRepr->Value = uVar6;
        }
        iVar4 = Gia_ObjHasRepr(pAig,nRefined);
        if (iVar4 != 0) {
          pGVar11 = Gia_ObjReprObj(pAig,nRefined);
          uVar6 = pRepr->Value;
          uVar7 = Abc_LitNotCond(pGVar11->Value,
                                 ((uint)((ulong)*(undefined8 *)pGVar11 >> 0x20) ^
                                 (uint)((ulong)*(undefined8 *)pRepr >> 0x20)) >> 0x1f);
          if (uVar6 == uVar7) {
            Gia_ObjSetProved(pAig,nRefined);
          }
          else {
            iVar4 = Abc_Lit2Var(pGVar11->Value);
            iVar5 = Abc_Lit2Var(pRepr->Value);
            if (iVar4 == iVar5) {
              __assert_fail("Abc_Lit2Var(pRepr->Value) != Abc_Lit2Var(pObj->Value)",
                            "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/proof/ssc/sscCore.c"
                            ,0x157,
                            "Gia_Man_t *Ssc_PerformSweepingInt(Gia_Man_t *, Gia_Man_t *, Ssc_Pars_t *)"
                           );
            }
            uVar2 = *(undefined8 *)pGVar11;
            uVar3 = *(undefined8 *)pRepr;
            uVar6 = Abc_LitIsCompl(pGVar11->Value);
            uVar7 = Abc_LitIsCompl(pRepr->Value);
            aVar9 = Abc_Clock();
            p_01->nSatCalls = p_01->nSatCalls + 1;
            iVar4 = Abc_Lit2Var(pGVar11->Value);
            iVar5 = Abc_Lit2Var(pRepr->Value);
            iVar4 = Ssc_ManCheckEquivalence
                              (p_01,iVar4,iVar5,
                               ((uint)((ulong)uVar2 >> 0x20) ^ (uint)((ulong)uVar3 >> 0x20)) >> 0x1f
                               ^ uVar6 ^ uVar7);
            if (iVar4 == -1) {
              p_01->nSatCallsUnsat = p_01->nSatCallsUnsat + 1;
              uVar6 = Abc_LitNotCond(pGVar11->Value,
                                     ((uint)((ulong)*(undefined8 *)pGVar11 >> 0x20) ^
                                     (uint)((ulong)*(undefined8 *)pRepr >> 0x20)) >> 0x1f);
              pRepr->Value = uVar6;
              Gia_ObjSetProved(pAig,nRefined);
            }
            else if (iVar4 == 1) {
              p_01->nSatCallsSat = p_01->nSatCallsSat + 1;
              Ssc_GiaSavePiPattern(pAig,p_01->vPattern);
              p_00 = p_01->vDisPairs;
              iVar4 = Gia_ObjRepr(p_01->pAig,nRefined);
              Vec_IntPush(p_00,iVar4);
              Vec_IntPush(p_01->vDisPairs,nRefined);
              iVar4 = Gia_ObjRepr(p_01->pAig,nRefined);
              if (0 < iVar4) {
                iVar4 = Gia_ObjRepr(p_01->pAig,nRefined);
                Ssc_GiaResimulateOneClass(p_01,iVar4,nRefined);
              }
            }
            else {
              if (iVar4 != 0) {
                __assert_fail("0",
                              "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/proof/ssc/sscCore.c"
                              ,0x171,
                              "Gia_Man_t *Ssc_PerformSweepingInt(Gia_Man_t *, Gia_Man_t *, Ssc_Pars_t *)"
                             );
              }
              p_01->nSatCallsUndec = p_01->nSatCallsUndec + 1;
            }
            aVar10 = Abc_Clock();
            p_01->timeSat = (aVar10 - aVar9) + p_01->timeSat;
          }
        }
      }
      nRefined = nRefined + 1;
    }
    if (1 < pAig->iPatsPi) {
      aVar9 = Abc_Clock();
      while (pAig->iPatsPi < pPars->nWords * 0x40) {
        Ssc_GiaSavePiPattern(pAig,p_01->vPivot);
      }
      Ssc_GiaSimRound(pAig);
      Ssc_GiaClassesRefine(pAig);
      if (pPars->fVerbose != 0) {
        Gia_ManEquivPrintClasses(pAig,0,0.0);
      }
      Ssc_GiaClassesCheckPairs(pAig,p_01->vDisPairs);
      Vec_IntClear(p_01->vDisPairs);
      aVar10 = Abc_Clock();
      p_01->timeSimSat = (aVar10 - aVar9) + p_01->timeSimSat;
    }
    pTemp = Gia_ManEquivReduce(pAig,0,0,1,0);
    if (pTemp == (Gia_Man_t *)0x0) {
      printf("There is no equivalences.\n");
      if (pAig->pReprs != (Gia_Rpr_t *)0x0) {
        free(pAig->pReprs);
        pAig->pReprs = (Gia_Rpr_t *)0x0;
      }
      if (pAig->pNexts != (int *)0x0) {
        free(pAig->pNexts);
        pAig->pNexts = (int *)0x0;
      }
      pTemp = Gia_ManDup(pAig);
    }
    pAig_local = Gia_ManCleanup(pTemp);
    Gia_ManStop(pTemp);
    aVar9 = Abc_Clock();
    p_01->timeTotal = aVar9 - aVar8;
    if (pPars->fVerbose != 0) {
      Ssc_ManPrintStats(p_01);
    }
    Ssc_ManStop(p_01);
    if (pPars->fVerbose != 0) {
      uVar6 = Gia_ManAndNum(pAig);
      uVar7 = Gia_ManAndNum(pAig_local);
      iVar4 = Gia_ManAndNum(pAig_local);
      iVar5 = Gia_ManAndNum(pAig);
      Abc_Print(1,"Reduction in AIG nodes:%8d  ->%8d (%6.2f %%).  ",
                100.0 - ((double)iVar4 * 100.0) / (double)iVar5,(ulong)uVar6,(ulong)uVar7);
      aVar9 = Abc_Clock();
      Abc_PrintTime(1,"Time",aVar9 - aVar8);
    }
  }
  return pAig_local;
}

Assistant:

Gia_Man_t * Ssc_PerformSweepingInt( Gia_Man_t * pAig, Gia_Man_t * pCare, Ssc_Pars_t * pPars )
{
    Ssc_Man_t * p;
    Gia_Man_t * pResult, * pTemp;
    Gia_Obj_t * pObj, * pRepr;
    abctime clk, clkTotal = Abc_Clock();
    int i, fCompl, nRefined, status;
clk = Abc_Clock();
    assert( Gia_ManRegNum(pCare) == 0 );
    assert( Gia_ManCiNum(pAig) == Gia_ManCiNum(pCare) );
    assert( Gia_ManIsNormalized(pAig) );
    assert( Gia_ManIsNormalized(pCare) );
    // reset random numbers
    Gia_ManRandom( 1 );
    // sweeping manager
    p = Ssc_ManStart( pAig, pCare, pPars );
    if ( p == (Ssc_Man_t *)(ABC_PTRINT_T)1 ) // UNSAT
        return Gia_ManDupZero( pAig );
    if ( p == NULL ) // timeout
        return Gia_ManDup( pAig );
    if ( p->pPars->fVerbose )
        printf( "Care set produced %d hits out of %d.\n", Ssc_GiaEstimateCare(p->pFraig, 5), 640 );
    // perform simulation 
    while ( 1 ) 
    {
        // simulate care set
        Ssc_GiaRandomPiPattern( p->pFraig, 5, NULL );
        Ssc_GiaSimRound( p->pFraig );
        // transfer care patterns to user's AIG
        if ( !Ssc_GiaTransferPiPattern( pAig, p->pFraig, p->vPivot ) )
            break;
        // simulate the main AIG
        Ssc_GiaSimRound( pAig );
        nRefined = Ssc_GiaClassesRefine( pAig );
        if ( pPars->fVerbose ) 
            Gia_ManEquivPrintClasses( pAig, 0, 0 );
        if ( nRefined <= Gia_ManCandNum(pAig) / 100 )
            break;
    }
p->timeSimInit += Abc_Clock() - clk;

    // prepare user's AIG
    Gia_ManFillValue(pAig);
    Gia_ManConst0(pAig)->Value = 0;
    Gia_ManForEachCi( pAig, pObj, i )
        pObj->Value = Gia_Obj2Lit( p->pFraig, Gia_ManCi(p->pFraig, i) );
//    Gia_ManLevelNum(pAig);
    // prepare swept AIG (should be done after starting SAT solver in Ssc_ManStart)
    Gia_ManHashStart( p->pFraig );
    // perform sweeping
    Ssc_GiaResetPiPattern( pAig, pPars->nWords );
    Ssc_GiaSavePiPattern( pAig, p->vPivot );
    Gia_ManForEachCand( pAig, pObj, i )
    {
        if ( pAig->iPatsPi == 64 * pPars->nWords )
        {
clk = Abc_Clock();
            Ssc_GiaSimRound( pAig );
            Ssc_GiaClassesRefine( pAig );
            if ( pPars->fVerbose ) 
                Gia_ManEquivPrintClasses( pAig, 0, 0 );
            Ssc_GiaClassesCheckPairs( pAig, p->vDisPairs );
            Vec_IntClear( p->vDisPairs );
            // prepare next patterns
            Ssc_GiaResetPiPattern( pAig, pPars->nWords );
            Ssc_GiaSavePiPattern( pAig, p->vPivot );
p->timeSimSat += Abc_Clock() - clk;
//printf( "\n" );
        }
        if ( Gia_ObjIsAnd(pObj) )
            pObj->Value = Gia_ManHashAnd( p->pFraig, Gia_ObjFanin0Copy(pObj), Gia_ObjFanin1Copy(pObj) );
        if ( !Gia_ObjHasRepr(pAig, i) )
            continue;
        pRepr = Gia_ObjReprObj(pAig, i);
        if ( (int)pObj->Value == Abc_LitNotCond( pRepr->Value, pRepr->fPhase ^ pObj->fPhase ) )
        {
            Gia_ObjSetProved( pAig, i );
            continue;
        }
        assert( Abc_Lit2Var(pRepr->Value) != Abc_Lit2Var(pObj->Value) );
        fCompl = pRepr->fPhase ^ pObj->fPhase ^ Abc_LitIsCompl(pRepr->Value) ^ Abc_LitIsCompl(pObj->Value);

        // perform SAT call
clk = Abc_Clock();
        p->nSatCalls++;
        status = Ssc_ManCheckEquivalence( p, Abc_Lit2Var(pRepr->Value), Abc_Lit2Var(pObj->Value), fCompl );
        if ( status == l_False )
        {
            p->nSatCallsUnsat++;
            pObj->Value = Abc_LitNotCond( pRepr->Value, pRepr->fPhase ^ pObj->fPhase );
            Gia_ObjSetProved( pAig, i );
        }
        else if ( status == l_True )
        {
            p->nSatCallsSat++;
            Ssc_GiaSavePiPattern( pAig, p->vPattern );
            Vec_IntPush( p->vDisPairs, Gia_ObjRepr(p->pAig, i) );
            Vec_IntPush( p->vDisPairs, i );
//            printf( "Try %2d and %2d: ", Gia_ObjRepr(p->pAig, i), i );
//            Vec_IntPrint( p->vPattern );
            if ( Gia_ObjRepr(p->pAig, i) > 0 )
                Ssc_GiaResimulateOneClass( p, Gia_ObjRepr(p->pAig, i), i );
        }
        else if ( status == l_Undef )
            p->nSatCallsUndec++;
        else assert( 0 );
p->timeSat += Abc_Clock() - clk;
    }
    if ( pAig->iPatsPi > 1 )
    {
clk = Abc_Clock();
        while ( pAig->iPatsPi < 64 * pPars->nWords )
            Ssc_GiaSavePiPattern( pAig, p->vPivot );
        Ssc_GiaSimRound( pAig );
        Ssc_GiaClassesRefine( pAig );
        if ( pPars->fVerbose ) 
            Gia_ManEquivPrintClasses( pAig, 0, 0 );
        Ssc_GiaClassesCheckPairs( pAig, p->vDisPairs );
        Vec_IntClear( p->vDisPairs );
p->timeSimSat += Abc_Clock() - clk;
    }
//    Gia_ManEquivPrintClasses( pAig, 1, 0 );
//    Gia_ManPrint( pAig );

    // generate the resulting AIG
    pResult = Gia_ManEquivReduce( pAig, 0, 0, 1, 0 );
    if ( pResult == NULL )
    {
        printf( "There is no equivalences.\n" );
        ABC_FREE( pAig->pReprs );
        ABC_FREE( pAig->pNexts );
        pResult = Gia_ManDup( pAig );
    }
    pResult = Gia_ManCleanup( pTemp = pResult );
    Gia_ManStop( pTemp );
    p->timeTotal = Abc_Clock() - clkTotal;
    if ( pPars->fVerbose )
        Ssc_ManPrintStats( p );
    Ssc_ManStop( p );
    // count the number of representatives
    if ( pPars->fVerbose ) 
    {
        Abc_Print( 1, "Reduction in AIG nodes:%8d  ->%8d (%6.2f %%).  ", 
            Gia_ManAndNum(pAig), Gia_ManAndNum(pResult), 
            100.0 - 100.0 * Gia_ManAndNum(pResult) / Gia_ManAndNum(pAig) );
        Abc_PrintTime( 1, "Time", Abc_Clock() - clkTotal );
    }
    return pResult;
}